

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool s2textformat::MakeLaxPolygon
               (string_view str,
               unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *lax_polygon)

{
  char *pcVar1;
  size_t sVar2;
  S2LaxPolygonShape *pSVar3;
  pointer pVVar4;
  bool bVar5;
  int iVar6;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  pointer *__ptr;
  char in_R8B;
  size_type len;
  pointer psVar7;
  string_view str_00;
  string_view str_01;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  value_type local_a8;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  local_88;
  unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *local_70;
  string_view local_68;
  string_view local_58;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_48;
  
  str_01.length_ = 0x3b;
  str_01.ptr_ = (char *)str.length_;
  vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)0x3b;
  local_70 = lax_polygon;
  SplitString(&local_48,(s2textformat *)str.ptr_,str_01,in_R8B);
  local_88.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = local_48.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar7 == local_48.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      absl::
      make_unique<S2LaxPolygonShape,std::vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>&>
                ((absl *)&local_a8,&local_88);
      pVVar4 = local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pSVar3 = (local_70->_M_t).
               super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>.
               _M_t.
               super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
               super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
      (local_70->_M_t).
      super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
      super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
      super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl = (S2LaxPolygonShape *)pVVar4;
      if (pSVar3 != (S2LaxPolygonShape *)0x0) {
        (**(code **)((long)(pSVar3->super_S2Shape)._vptr_S2Shape + 8))();
      }
      if ((S2LaxPolygonShape *)
          local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (S2LaxPolygonShape *)0x0) {
        (*((S2Shape *)
          (local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start)->c_)->_vptr_S2Shape[1])();
      }
LAB_0022f739:
      std::
      vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
      ::~vector(&local_88);
      if (local_48.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return psVar7 == local_48.
                       super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
    }
    pcVar1 = psVar7->ptr_;
    sVar2 = psVar7->length_;
    absl::string_view::string_view(&local_58,"full");
    if ((sVar2 == local_58.length_) &&
       ((vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                    CONCAT71((int7)((ulong)vertices >> 8),sVar2 == 0 || pcVar1 == local_58.ptr_),
        sVar2 == 0 || pcVar1 == local_58.ptr_ ||
        (iVar6 = bcmp(pcVar1,local_58.ptr_,sVar2), iVar6 == 0)))) {
      local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
      ::emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
                  *)&local_88,&local_a8);
      if ((S2LaxPolygonShape *)
          local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (S2LaxPolygonShape *)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pcVar1 = psVar7->ptr_;
      sVar2 = psVar7->length_;
      absl::string_view::string_view(&local_68,"empty");
      if ((sVar2 != local_68.length_) ||
         ((vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                      CONCAT71((int7)((ulong)vertices >> 8),sVar2 == 0 || pcVar1 == local_68.ptr_),
          sVar2 != 0 && pcVar1 != local_68.ptr_ &&
          (iVar6 = bcmp(pcVar1,local_68.ptr_,sVar2), iVar6 != 0)))) {
        local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        str_00.length_ = (size_type)&local_a8;
        str_00.ptr_ = (char *)psVar7->length_;
        bVar5 = ParsePoints((s2textformat *)psVar7->ptr_,str_00,vertices);
        if (!bVar5) {
          if ((S2LaxPolygonShape *)
              local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (S2LaxPolygonShape *)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_0022f739;
        }
        std::
        vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
        ::push_back(&local_88,&local_a8);
        if ((S2LaxPolygonShape *)
            local_a8.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
            super__Vector_impl_data._M_start != (S2LaxPolygonShape *)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar5) goto LAB_0022f739;
      }
    }
    psVar7 = psVar7 + 1;
  } while( true );
}

Assistant:

bool MakeLaxPolygon(string_view str,
                    unique_ptr<S2LaxPolygonShape>* lax_polygon) {
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<vector<S2Point>> loops;
  for (const auto& loop_str : loop_strs) {
    if (loop_str == "full") {
      loops.push_back(vector<S2Point>());
    } else if (loop_str != "empty") {
      vector<S2Point> points;
      if (!ParsePoints(loop_str, &points)) return false;
      loops.push_back(points);
    }
  }
  *lax_polygon = make_unique<S2LaxPolygonShape>(loops);
  return true;
}